

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

bool __thiscall QFontComboBox::event(QFontComboBox *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  QListView *pQVar4;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QListView *lview;
  QRect *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QWidget *this_00;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Resize) {
    QComboBox::view((QComboBox *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    pQVar4 = qobject_cast<QListView*>((QObject *)0x59a8af);
    if (pQVar4 != (QListView *)0x0) {
      QWidget::window(in_RDI);
      iVar3 = QWidget::width((QWidget *)0x59a8d5);
      local_c = (iVar3 * 5) / 3;
      QWidgetPrivate::availableScreenGeometry(in_RDI);
      local_10 = QRect::width(in_stack_ffffffffffffffa8);
      qMin<int>(&local_c,&local_10);
      QWidget::setFixedWidth(this_00,(int)((ulong)in_RSI >> 0x20));
    }
  }
  bVar1 = QComboBox::event((QComboBox *)this_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QFontComboBox::event(QEvent *e)
{
    if (e->type() == QEvent::Resize) {
        QListView *lview = qobject_cast<QListView*>(view());
        if (lview) {
            lview->window()->setFixedWidth(qMin(width() * 5 / 3,
                                           QWidgetPrivate::availableScreenGeometry(lview).width()));
        }
    }
    return QComboBox::event(e);
}